

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::SetCacheEntryValue(cmState *this,string *key,string *value)

{
  cmCacheManager::SetCacheEntryValue(this->CacheManager,key,value);
  return;
}

Assistant:

void cmState::SetCacheEntryValue(std::string const& key,
                                 std::string const& value)
{
  this->CacheManager->SetCacheEntryValue(key, value);
}